

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void module_free_common(lys_module *module,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  ly_ctx *ctx;
  lys_ident *plVar1;
  lys_feature *plVar2;
  ly_ctx *ctx_00;
  lys_deviation *plVar3;
  lys_unique *plVar4;
  lys_ext *plVar5;
  lys_node *plVar6;
  lys_unique *plVar7;
  lys_deviate *plVar8;
  lys_node *plVar9;
  int shallow;
  long lVar10;
  ulong uVar11;
  lys_node *plVar12;
  lys_node *plVar13;
  lys_node *plVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  ctx = module->ctx;
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("module->ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xb45,
                  "void module_free_common(struct lys_module *, void (*)(const struct lys_node *, void *))"
                 );
  }
  if (module->imp_size != '\0') {
    lVar10 = 0;
    uVar17 = 0;
    do {
      lydict_remove(ctx,*(char **)(module->imp->rev + lVar10 + -8));
      lydict_remove(ctx,*(char **)(module->imp->rev + lVar10 + 0x18));
      lydict_remove(ctx,*(char **)(module->imp->rev + lVar10 + 0x20));
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(module->imp->rev + lVar10 + 0x10),
                 (uint)(byte)module->imp->rev[lVar10 + 0xb],private_destructor);
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x38;
    } while (uVar17 < module->imp_size);
  }
  free(module->imp);
  if ((module->field_0x40 & 1) == 0) {
    plVar13 = module->data;
    while (plVar13 != (lys_node *)0x0) {
      plVar6 = plVar13->next;
      lys_node_free(plVar13,private_destructor,0);
      plVar13 = plVar6;
    }
  }
  lydict_remove(ctx,module->dsc);
  lydict_remove(ctx,module->ref);
  lydict_remove(ctx,module->org);
  lydict_remove(ctx,module->contact);
  lydict_remove(ctx,module->filepath);
  if (module->rev_size != '\0') {
    lVar10 = 0;
    uVar17 = 0;
    do {
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(module->rev->date + lVar10 + 0x10),
                 (uint)(byte)module->rev->date[lVar10 + 0xb],private_destructor);
      lydict_remove(ctx,*(char **)(module->rev->date + lVar10 + 0x18));
      lydict_remove(ctx,*(char **)(module->rev->date + lVar10 + 0x20));
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x28;
    } while (uVar17 < module->rev_size);
  }
  free(module->rev);
  if (module->ident_size != 0) {
    lVar10 = 0x40;
    uVar17 = 0;
    do {
      plVar1 = module->ident;
      if (plVar1 != (lys_ident *)0x0) {
        free(*(void **)(plVar1->padding + lVar10 + -0x24));
        ly_set_free(*(ly_set **)(plVar1->padding + lVar10 + -0x1c));
        lydict_remove(ctx,*(char **)(plVar1->padding + lVar10 + -0x5c));
        lydict_remove(ctx,*(char **)(plVar1->padding + lVar10 + -0x54));
        lydict_remove(ctx,*(char **)(plVar1->padding + lVar10 + -0x4c));
        lys_iffeature_free(ctx,*(lys_iffeature **)(plVar1->padding + lVar10 + -0x34),
                           plVar1->padding[lVar10 + -0x41],0,private_destructor);
        lys_extension_instances_free
                  (ctx,*(lys_ext_instance ***)(plVar1->padding + lVar10 + -0x3c),
                   (uint)plVar1->padding[lVar10 + -0x42],private_destructor);
      }
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x48;
    } while (uVar17 < module->ident_size);
  }
  module->ident_size = 0;
  free(module->ident);
  if (module->tpdf_size != 0) {
    lVar10 = 0;
    uVar17 = 0;
    do {
      lys_tpdf_free(ctx,(lys_tpdf *)(module->tpdf->padding + lVar10 + -0x1d),private_destructor);
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x80;
    } while (uVar17 < module->tpdf_size);
  }
  free(module->tpdf);
  lys_extension_instances_free(ctx,module->ext,(uint)module->ext_size,private_destructor);
  if (module->augment_size != '\0') {
    lVar10 = 0;
    uVar17 = 0;
    do {
      lys_augment_free(ctx,(lys_node_augment *)(module->augment->padding + lVar10 + -0x1c),
                       private_destructor);
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x68;
    } while (uVar17 < module->augment_size);
  }
  free(module->augment);
  if (module->features_size != '\0') {
    lVar10 = 0;
    uVar17 = 0;
    do {
      plVar2 = module->features;
      lydict_remove(ctx,*(char **)(plVar2->padding + lVar10 + -0x1c));
      lydict_remove(ctx,*(char **)(plVar2->padding + lVar10 + -0x14));
      lydict_remove(ctx,*(char **)(plVar2->padding + lVar10 + -0xc));
      lys_iffeature_free(ctx,*(lys_iffeature **)(plVar2->padding + lVar10 + 0xc),
                         plVar2->padding[lVar10 + -1],0,private_destructor);
      ly_set_free(*(ly_set **)(plVar2->padding + lVar10 + 0x1c));
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(plVar2->padding + lVar10 + 4),
                 (uint)plVar2->padding[lVar10 + -2],private_destructor);
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x40;
    } while (uVar17 < module->features_size);
  }
  free(module->features);
  if (module->deviation_size != '\0') {
    uVar17 = 0;
    do {
      ctx_00 = module->ctx;
      plVar3 = module->deviation;
      lydict_remove(ctx_00,plVar3[uVar17].target_name);
      lydict_remove(ctx_00,plVar3[uVar17].dsc);
      lydict_remove(ctx_00,plVar3[uVar17].ref);
      lys_extension_instances_free
                (ctx_00,plVar3[uVar17].ext,(uint)plVar3[uVar17].ext_size,private_destructor);
      if (plVar3[uVar17].deviate != (lys_deviate *)0x0) {
        plVar13 = plVar3[uVar17].orig_node;
        if (plVar13 != (lys_node *)0x0) {
          plVar6 = plVar13;
          if ((plVar3[uVar17].deviate)->mod == LY_DEVIATE_NO) {
            do {
              plVar6->module = module;
              if ((plVar6->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                plVar9 = plVar6->child;
              }
              else {
                plVar9 = (lys_node *)0x0;
              }
              if (plVar9 == (lys_node *)0x0) {
                if (plVar6 == plVar13) break;
                plVar9 = plVar6->next;
              }
              if (plVar9 == (lys_node *)0x0) {
                do {
                  plVar6 = plVar6->parent;
                  if (plVar6->nodetype == LYS_AUGMENT) {
                    plVar6 = plVar6->prev;
                  }
                  if (plVar6 == (lys_node *)0x0) {
LAB_00161aa8:
                    plVar12 = (lys_node *)0x0;
                  }
                  else {
                    if (plVar6->nodetype == LYS_EXT) {
                      if (plVar6->padding[1] != '\x01') goto LAB_00161aa8;
                      plVar12 = (lys_node *)plVar6->dsc;
                    }
                    else {
                      plVar12 = plVar6->parent;
                      if (plVar12 == (lys_node *)0x0) goto LAB_00161aa8;
                    }
                    if (plVar12->nodetype == LYS_AUGMENT) {
                      plVar12 = plVar12->prev;
                    }
                  }
                  if (plVar13->nodetype == LYS_EXT) {
                    if (plVar13->padding[1] == '\x01') {
                      plVar14 = (lys_node *)plVar13->dsc;
                      goto LAB_00161ac7;
                    }
LAB_00161ad7:
                    plVar14 = (lys_node *)0x0;
                  }
                  else {
                    plVar14 = plVar13->parent;
                    if (plVar14 == (lys_node *)0x0) goto LAB_00161ad7;
LAB_00161ac7:
                    if (plVar14->nodetype == LYS_AUGMENT) {
                      plVar14 = plVar14->prev;
                    }
                  }
                } while ((plVar12 != plVar14) && (plVar9 = plVar6->next, plVar9 == (lys_node *)0x0))
                ;
              }
              plVar6 = plVar9;
            } while (plVar9 != (lys_node *)0x0);
            shallow = 0;
          }
          else {
            plVar13->module = module;
            shallow = 1;
          }
          lys_node_free(plVar13,(_func_void_lys_node_ptr_void_ptr *)0x0,shallow);
        }
        if (plVar3[uVar17].deviate_size != '\0') {
          uVar16 = 0;
          do {
            lys_extension_instances_free
                      (ctx_00,plVar3[uVar17].deviate[uVar16].ext,
                       (uint)plVar3[uVar17].deviate[uVar16].ext_size,private_destructor);
            plVar8 = plVar3[uVar17].deviate;
            if (plVar8[uVar16].dflt_size != '\0') {
              uVar11 = 0;
              do {
                lydict_remove(ctx_00,plVar8[uVar16].dflt[uVar11]);
                uVar11 = uVar11 + 1;
                plVar8 = plVar3[uVar17].deviate;
              } while (uVar11 < plVar8[uVar16].dflt_size);
            }
            free(plVar8[uVar16].dflt);
            lydict_remove(ctx_00,plVar3[uVar17].deviate[uVar16].units);
            plVar8 = plVar3[uVar17].deviate;
            if (plVar8[uVar16].mod == LY_DEVIATE_DEL) {
              if (plVar8[uVar16].must_size != '\0') {
                lVar10 = 0;
                uVar11 = 0;
                do {
                  lys_restr_free(ctx_00,(lys_restr *)((long)&(plVar8[uVar16].must)->expr + lVar10),
                                 private_destructor);
                  uVar11 = uVar11 + 1;
                  plVar8 = plVar3[uVar17].deviate;
                  lVar10 = lVar10 + 0x38;
                } while (uVar11 < plVar8[uVar16].must_size);
              }
              free(plVar8[uVar16].must);
              plVar8 = plVar3[uVar17].deviate;
              if (plVar8[uVar16].unique_size != '\0') {
                uVar11 = 0;
                do {
                  plVar4 = plVar3[uVar17].deviate[uVar16].unique;
                  plVar7 = plVar4 + uVar11;
                  if (plVar4[uVar11].expr_size != '\0') {
                    uVar15 = 0;
                    do {
                      lydict_remove(ctx_00,plVar7->expr[uVar15]);
                      uVar15 = uVar15 + 1;
                      plVar4 = plVar3[uVar17].deviate[uVar16].unique;
                      plVar7 = plVar4 + uVar11;
                    } while (uVar15 < plVar4[uVar11].expr_size);
                  }
                  free(plVar7->expr);
                  uVar11 = uVar11 + 1;
                  plVar8 = plVar3[uVar17].deviate;
                } while (uVar11 < plVar8[uVar16].unique_size);
              }
              free(plVar8[uVar16].unique);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < plVar3[uVar17].deviate_size);
        }
        free(plVar3[uVar17].deviate);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < module->deviation_size);
  }
  free(module->deviation);
  if (module->extensions_size != '\0') {
    lVar10 = 0x28;
    uVar17 = 0;
    do {
      plVar5 = module->extensions;
      lydict_remove(ctx,*(char **)(plVar5->padding + lVar10 + -0x43));
      lydict_remove(ctx,*(char **)(plVar5->padding + lVar10 + -0x3b));
      lydict_remove(ctx,*(char **)(plVar5->padding + lVar10 + -0x33));
      lydict_remove(ctx,*(char **)(plVar5->padding + lVar10 + -0x1b));
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(plVar5->padding + lVar10 + -0x23),
                 (uint)plVar5->padding[lVar10 + -0x29],private_destructor);
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x40;
    } while (uVar17 < module->extensions_size);
  }
  free(module->extensions);
  lydict_remove(ctx,module->name);
  lydict_remove(ctx,module->prefix);
  return;
}

Assistant:

static void
module_free_common(struct lys_module *module, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    struct ly_ctx *ctx;
    struct lys_node *next, *iter;
    unsigned int i;

    assert(module->ctx);
    ctx = module->ctx;

    /* just free the import array, imported modules will stay in the context */
    for (i = 0; i < module->imp_size; i++) {
        lydict_remove(ctx, module->imp[i].prefix);
        lydict_remove(ctx, module->imp[i].dsc);
        lydict_remove(ctx, module->imp[i].ref);
        lys_extension_instances_free(ctx, module->imp[i].ext, module->imp[i].ext_size, private_destructor);
    }
    free(module->imp);

    /* submodules don't have data tree, the data nodes
     * are placed in the main module altogether */
    if (!module->type) {
        LY_TREE_FOR_SAFE(module->data, next, iter) {
            lys_node_free(iter, private_destructor, 0);
        }
    }

    lydict_remove(ctx, module->dsc);
    lydict_remove(ctx, module->ref);
    lydict_remove(ctx, module->org);
    lydict_remove(ctx, module->contact);
    lydict_remove(ctx, module->filepath);

    /* revisions */
    for (i = 0; i < module->rev_size; i++) {
        lys_extension_instances_free(ctx, module->rev[i].ext, module->rev[i].ext_size, private_destructor);
        lydict_remove(ctx, module->rev[i].dsc);
        lydict_remove(ctx, module->rev[i].ref);
    }
    free(module->rev);

    /* identities */
    for (i = 0; i < module->ident_size; i++) {
        lys_ident_free(ctx, &module->ident[i], private_destructor);
    }
    module->ident_size = 0;
    free(module->ident);

    /* typedefs */
    for (i = 0; i < module->tpdf_size; i++) {
        lys_tpdf_free(ctx, &module->tpdf[i], private_destructor);
    }
    free(module->tpdf);

    /* extension instances */
    lys_extension_instances_free(ctx, module->ext, module->ext_size, private_destructor);

    /* augment */
    for (i = 0; i < module->augment_size; i++) {
        lys_augment_free(ctx, &module->augment[i], private_destructor);
    }
    free(module->augment);

    /* features */
    for (i = 0; i < module->features_size; i++) {
        lys_feature_free(ctx, &module->features[i], private_destructor);
    }
    free(module->features);

    /* deviations */
    for (i = 0; i < module->deviation_size; i++) {
        lys_deviation_free(module, &module->deviation[i], private_destructor);
    }
    free(module->deviation);

    /* extensions */
    for (i = 0; i < module->extensions_size; i++) {
        lys_extension_free(ctx, &module->extensions[i], private_destructor);
    }
    free(module->extensions);

    lydict_remove(ctx, module->name);
    lydict_remove(ctx, module->prefix);
}